

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O0

int check_utf8_sequences(void)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_210;
  char *end;
  char *start;
  int result;
  int check;
  char *title;
  int k;
  int failed;
  yaml_parser_t parser;
  
  title._4_4_ = 0;
  printf("checking utf-8 sequences...\n");
  title._0_4_ = 0;
  while (utf8_sequences[(int)title].test != (char *)0x0) {
    iVar1 = utf8_sequences[(int)title].result;
    local_210 = utf8_sequences[(int)title].test;
    printf("\t%s:\n",utf8_sequences[(int)title].title);
    end = local_210;
    while( true ) {
      while( true ) {
        bVar3 = false;
        if (*local_210 != '|') {
          bVar3 = *local_210 != '!';
        }
        if (!bVar3) break;
        local_210 = local_210 + 1;
      }
      yaml_parser_initialize((yaml_parser_t *)&k);
      yaml_parser_set_input_string((yaml_parser_t *)&k,(uchar *)end,(long)local_210 - (long)end);
      iVar2 = yaml_parser_update_buffer((yaml_parser_t *)&k,(long)local_210 - (long)end);
      if (iVar2 == iVar1) {
        printf("\t\t+ ");
      }
      else {
        printf("\t\t- ");
        title._4_4_ = title._4_4_ + 1;
      }
      if (k == 0) {
        printf("(no error)\n");
      }
      else if (k == 2) {
        if ((uint)parser.problem_offset == 0xffffffff) {
          printf("(reader error: %s at %ld)\n",parser._0_8_,parser.problem);
        }
        else {
          printf("(reader error: %s: #%X at %ld)\n",parser._0_8_,(ulong)(uint)parser.problem_offset,
                 parser.problem);
        }
      }
      if (*local_210 == '!') break;
      local_210 = local_210 + 1;
      yaml_parser_delete((yaml_parser_t *)&k);
      end = local_210;
    }
    printf("\n");
    title._0_4_ = (int)title + 1;
  }
  printf("checking utf-8 sequences: %d fail(s)\n",(ulong)title._4_4_);
  return title._4_4_;
}

Assistant:

int check_utf8_sequences(void)
{
    yaml_parser_t parser;
    int failed = 0;
    int k;
    printf("checking utf-8 sequences...\n");
    for (k = 0; utf8_sequences[k].test; k++) {
        char *title = utf8_sequences[k].title;
        int check = utf8_sequences[k].result;
        int result;
        char *start = utf8_sequences[k].test;
        char *end = start;
        printf("\t%s:\n", title);
        while(1) {
            while (*end != '|' && *end != '!') end++;
            yaml_parser_initialize(&parser);
            yaml_parser_set_input_string(&parser, (unsigned char *)start, end-start);
            result = yaml_parser_update_buffer(&parser, end-start);
            if (result != check) {
                printf("\t\t- ");
                failed ++;
            }
            else {
                printf("\t\t+ ");
            }
            if (!parser.error) {
                printf("(no error)\n");
            }
            else if (parser.error == YAML_READER_ERROR) {
                if (parser.problem_value != -1) {
                    printf("(reader error: %s: #%X at %ld)\n",
                            parser.problem, parser.problem_value, (long)parser.problem_offset);
                }
                else {
                    printf("(reader error: %s at %ld)\n",
                            parser.problem, (long)parser.problem_offset);
                }
            }
            if (*end == '!') break;
            start = ++end;
            yaml_parser_delete(&parser);
        };
        printf("\n");
    }
    printf("checking utf-8 sequences: %d fail(s)\n", failed);
    return failed;
}